

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator08buggy.cpp
# Opt level: O2

double expression(void)

{
  bool bVar1;
  double dVar2;
  Token t;
  double local_a0;
  double local_98;
  undefined1 local_90 [48];
  undefined1 local_60 [48];
  
  local_a0 = term();
  do {
    Token_stream::get((Token *)local_90,&ts);
    if (local_90[0] == '-') {
      dVar2 = term();
      local_a0 = local_a0 - dVar2;
LAB_00103005:
      bVar1 = true;
    }
    else {
      if (local_90[0] == '+') {
        dVar2 = term();
        local_a0 = local_a0 + dVar2;
        goto LAB_00103005;
      }
      Token::Token((Token *)local_60,(Token *)local_90);
      Token_stream::unget(&ts,(Token *)local_60);
      std::__cxx11::string::~string((string *)(local_60 + 0x10));
      bVar1 = false;
      local_98 = local_a0;
    }
    std::__cxx11::string::~string((string *)(local_90 + 0x10));
    if (!bVar1) {
      return local_98;
    }
  } while( true );
}

Assistant:

double expression()
{
	double left = term();
	while (true)
	{
		Token t = ts.get();
		switch (t.kind) {
		case '+':
			left += term();
			break;
		case '-':
			left -= term();
			break;
		default:
			ts.unget(t);
			return left;
		}
	}
}